

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetErrorBias(void *arkode_mem,realtype bias)

{
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = arkAccessHAdaptMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8,(ARKodeHAdaptMem *)0xeac78a);
  if (local_4 == 0) {
    if (1.0 <= in_XMM0_Qa) {
      *(double *)((long)in_stack_ffffffffffffffd8 + 0x78) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x78) = 0x3ff8000000000000;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetErrorBias(void *arkode_mem, realtype bias)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetErrorBias",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set allowed value, otherwise set default */
  if (bias < ONE) {
    hadapt_mem->bias = BIAS;
  } else {
    hadapt_mem->bias = bias;
  }

  return(ARK_SUCCESS);
}